

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbar.cpp
# Opt level: O2

void __thiscall QToolBar::QToolBar(QToolBar *this,QWidget *parent)

{
  QToolBarPrivate *this_00;
  
  this_00 = (QToolBarPrivate *)operator_new(0x290);
  QToolBarPrivate::QToolBarPrivate(this_00);
  QWidget::QWidget(&this->super_QWidget,(QWidgetPrivate *)this_00,parent,(WindowFlags)0x0);
  *(undefined ***)&this->super_QWidget = &PTR_metaObject_007d7af8;
  *(undefined ***)&(this->super_QWidget).super_QPaintDevice = &PTR__QToolBar_007d7cb0;
  QToolBarPrivate::init
            (*(QToolBarPrivate **)&(this->super_QWidget).field_0x8,(EVP_PKEY_CTX *)this_00);
  return;
}

Assistant:

QToolBar::QToolBar(QWidget *parent)
    : QWidget(*new QToolBarPrivate, parent, { })
{
    Q_D(QToolBar);
    d->init();
}